

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

int parse_canframe(char *cs,cu_t *cu)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  byte bVar13;
  
  sVar4 = strlen(cs);
  memset(cu,0,0x810);
  if ((int)sVar4 < 4) {
    return 0;
  }
  if (cs[3] == '#') {
    uVar12 = 0;
    bVar8 = 8;
    lVar5 = 0;
    do {
      cVar1 = cs[lVar5];
      bVar13 = cVar1 - 0x30;
      if (9 < bVar13) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar13 = cVar1 - 0x37;
        }
        else {
          if ((byte)(cVar1 + 0x99U) < 0xfa) {
            return 0;
          }
          bVar13 = cVar1 + 0xa9;
        }
      }
      uVar12 = uVar12 | (uint)bVar13 << (bVar8 & 0x1f);
      (cu->cc).can_id = uVar12;
      lVar5 = lVar5 + 1;
      bVar8 = bVar8 - 4;
    } while (lVar5 != 3);
    uVar11 = 4;
  }
  else {
    if (cs[5] == '#') {
      uVar12 = 0;
      bVar8 = 0x10;
      lVar5 = 0;
      do {
        cVar1 = cs[lVar5];
        bVar13 = cVar1 - 0x30;
        if (9 < bVar13) {
          if ((byte)(cVar1 + 0xbfU) < 6) {
            bVar13 = cVar1 - 0x37;
          }
          else {
            if ((byte)(cVar1 + 0x99U) < 0xfa) {
              return 0;
            }
            bVar13 = cVar1 + 0xa9;
          }
        }
        uVar12 = uVar12 | (uint)bVar13 << (bVar8 & 0x1f);
        (cu->cc).can_id = uVar12;
        lVar5 = lVar5 + 1;
        bVar8 = bVar8 - 4;
      } while (lVar5 != 5);
      uVar12 = uVar12 & 0x7ff | (uVar12 & 0xff000) << 4;
      uVar11 = 6;
    }
    else {
      if (cs[8] != '#') {
        return 0;
      }
      uVar12 = 0;
      bVar8 = 0x1c;
      lVar5 = 0;
      do {
        cVar1 = cs[lVar5];
        bVar13 = cVar1 - 0x30;
        if (9 < bVar13) {
          if ((byte)(cVar1 + 0xbfU) < 6) {
            bVar13 = cVar1 - 0x37;
          }
          else {
            if ((byte)(cVar1 + 0x99U) < 0xfa) {
              return 0;
            }
            bVar13 = cVar1 + 0xa9;
          }
        }
        uVar12 = uVar12 | (uint)bVar13 << (bVar8 & 0x1f);
        (cu->cc).can_id = uVar12;
        lVar5 = lVar5 + 1;
        bVar8 = bVar8 - 4;
      } while (lVar5 != 8);
      uVar11 = 9;
      if ((uVar12 >> 0x1d & 1) != 0) goto LAB_00105f77;
      uVar12 = uVar12 | 0x80000000;
      uVar11 = 9;
    }
    (cu->cc).can_id = uVar12;
  }
LAB_00105f77:
  cVar1 = cs[uVar11];
  if (cVar1 == '#') {
    cVar1 = cs[uVar11 + 1];
    bVar8 = cVar1 - 0x30;
    if (9 < bVar8) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar8 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar8 = cVar1 + 0xa9;
      }
    }
    (cu->cc).__pad = bVar8 | 4;
    uVar11 = (ulong)((int)uVar11 + 2);
    iVar10 = 0x48;
    uVar12 = 0x40;
    bVar3 = false;
LAB_0010613e:
    lVar5 = 8;
    bVar2 = false;
  }
  else {
    if ((cVar1 == 'r') || (cVar1 == 'R')) {
      (cu->cc).can_id = uVar12 | 0x40000000;
      cVar1 = cs[uVar11 + 1];
      iVar10 = 0x10;
      if (cVar1 == '\0') {
        return 0x10;
      }
      bVar8 = cVar1 - 0x30;
      if (9 < bVar8) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          return 0x10;
        }
        if (5 < (byte)(cVar1 + 0x9fU)) {
          return 0x10;
        }
        bVar8 = cVar1 + 0xa9;
      }
      if (8 < bVar8) {
        return 0x10;
      }
      (cu->fd).len = bVar8;
      if (bVar8 != 8) {
        return 0x10;
      }
      if (cs[uVar11 + 2] != '_') {
        return 0x10;
      }
      cVar1 = cs[uVar11 + 3];
      bVar8 = cVar1 - 0x30U;
      if (9 < (byte)(cVar1 - 0x30U)) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar8 = cVar1 - 0x37;
        }
        else {
          bVar8 = 0x10;
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar8 = cVar1 + 0xa9;
          }
        }
      }
      goto joined_r0x0010624e;
    }
    if (cs[uVar11 + 0xe] != '#') {
      iVar10 = 0x10;
      uVar12 = 8;
      bVar3 = true;
      goto LAB_0010613e;
    }
    if (cs[uVar11 + 2] != ':') {
      return 0;
    }
    if (cs[uVar11 + 5] != ':') {
      return 0;
    }
    bVar8 = cVar1 - 0x30;
    if (9 < bVar8) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar8 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar8 = cVar1 + 0xa9;
      }
    }
    (cu->fd).len = bVar8 << 4;
    cVar1 = cs[uVar11 + 1];
    bVar13 = cVar1 - 0x30;
    if (9 < bVar13) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar13 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar13 = cVar1 + 0xa9;
      }
    }
    (cu->fd).len = bVar8 << 4 | bVar13 | 0x80;
    cVar1 = cs[uVar11 + 3];
    bVar8 = cVar1 - 0x30;
    if (9 < bVar8) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar8 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar8 = cVar1 + 0xa9;
      }
    }
    (cu->cc).__pad = bVar8 << 4;
    cVar1 = cs[uVar11 + 4];
    bVar13 = cVar1 - 0x30;
    if (9 < bVar13) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar13 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar13 = cVar1 + 0xa9;
      }
    }
    (cu->cc).__pad = bVar13 | bVar8 << 4;
    uVar12 = 0;
    iVar10 = 0x1c;
    do {
      cVar1 = cs[uVar11 + 6];
      bVar8 = cVar1 - 0x30;
      if (9 < bVar8) {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar8 = cVar1 - 0x37;
        }
        else {
          if ((byte)(cVar1 + 0x99U) < 0xfa) {
            return 0;
          }
          bVar8 = cVar1 + 0xa9;
        }
      }
      uVar12 = uVar12 | (uint)bVar8 << ((byte)iVar10 & 0x1f);
      (cu->xl).af = uVar12;
      uVar11 = uVar11 + 1;
      iVar10 = iVar10 + -4;
    } while (iVar10 != -4);
    lVar5 = 0xc;
    iVar10 = 0x80c;
    bVar2 = true;
    uVar12 = 0x800;
    bVar3 = false;
    uVar11 = (ulong)((int)uVar11 + 7);
  }
  uVar6 = 0;
  do {
    uVar9 = (int)uVar11 + (uint)(cs[(int)uVar11] == '.');
    uVar7 = uVar6;
    if ((int)sVar4 <= (int)uVar9) break;
    cVar1 = cs[(int)uVar9];
    bVar8 = cVar1 - 0x30;
    if (9 < bVar8) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar8 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar8 = cVar1 + 0xa9;
      }
    }
    cu->field3[uVar6 + lVar5] = bVar8 << 4;
    cVar1 = cs[(long)(int)uVar9 + 1];
    bVar13 = cVar1 - 0x30;
    if (9 < bVar13) {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        bVar13 = cVar1 - 0x37;
      }
      else {
        if ((byte)(cVar1 + 0x99U) < 0xfa) {
          return 0;
        }
        bVar13 = cVar1 + 0xa9;
      }
    }
    uVar9 = uVar9 + 2;
    uVar11 = (ulong)uVar9;
    cu->field3[uVar6 + lVar5] = bVar13 | bVar8 << 4;
    uVar6 = uVar6 + 1;
    uVar7 = (ulong)uVar12;
  } while (uVar12 != uVar6);
  if (bVar2) {
    (cu->xl).len = (__u16)uVar7;
  }
  else {
    (cu->fd).len = (__u8)uVar7;
  }
  if (!bVar3 || (int)uVar7 != 8) {
    return iVar10;
  }
  if (cs[(int)uVar9] != '_') {
    return iVar10;
  }
  cVar1 = cs[(long)(int)uVar9 + 1];
  bVar8 = cVar1 - 0x30U;
  if (9 < (byte)(cVar1 - 0x30U)) {
    if ((byte)(cVar1 + 0xbfU) < 6) {
      bVar8 = cVar1 - 0x37;
    }
    else {
      bVar8 = 0x10;
      if ((byte)(cVar1 + 0x9fU) < 6) {
        bVar8 = cVar1 + 0xa9;
      }
    }
  }
joined_r0x0010624e:
  if ((byte)(bVar8 - 9) < 7) {
    (cu->cc).len8_dlc = bVar8;
  }
  return iVar10;
}

Assistant:

int parse_canframe(char *cs, cu_t *cu)
{
	/* documentation see lib.h */

	int i, idx, dlen, len;
	int maxdlen = CAN_MAX_DLEN;
	int mtu = CAN_MTU;
	__u8 *data = cu->fd.data; /* fill CAN CC/FD data by default */
	canid_t tmp;

	len = strlen(cs);
	//printf("'%s' len %d\n", cs, len);

	memset(cu, 0, sizeof(*cu)); /* init CAN CC/FD/XL frame, e.g. LEN = 0 */

	if (len < 4)
		return 0;

	if (cs[3] == CANID_DELIM) { /* 3 digits SFF */

		idx = 4;
		for (i = 0; i < 3; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (2 - i) * 4;
		}

	} else if (cs[5] == CANID_DELIM) { /* 5 digits CAN XL VCID/PRIO*/

		idx = 6;
		for (i = 0; i < 5; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->xl.prio |= tmp << (4 - i) * 4;
		}

		/* the VCID starts at bit position 16 */
		tmp = (cu->xl.prio << 4) & CANXL_VCID_MASK;
		cu->xl.prio &= CANXL_PRIO_MASK;
		cu->xl.prio |= tmp;

	} else if (cs[8] == CANID_DELIM) { /* 8 digits EFF */

		idx = 9;
		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (7 - i) * 4;
		}
		if (!(cu->cc.can_id & CAN_ERR_FLAG)) /* 8 digits but no errorframe?  */
			cu->cc.can_id |= CAN_EFF_FLAG;   /* then it is an extended frame */

	} else
		return 0;

	if ((cs[idx] == 'R') || (cs[idx] == 'r')) { /* RTR frame */
		cu->cc.can_id |= CAN_RTR_FLAG;

		/* check for optional DLC value for CAN 2.0B frames */
		if (cs[++idx] && (tmp = asc2nibble(cs[idx++])) <= CAN_MAX_DLEN) {
			cu->cc.len = tmp;

			/* check for optional raw DLC value for CAN 2.0B frames */
			if ((tmp == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
				tmp = asc2nibble(cs[idx]);
				if ((tmp > CAN_MAX_DLEN) && (tmp <= CAN_MAX_RAW_DLC))
					cu->cc.len8_dlc = tmp;
			}
		}
		return mtu;
	}

	if (cs[idx] == CANID_DELIM) { /* CAN FD frame escape char '##' */
		maxdlen = CANFD_MAX_DLEN;
		mtu = CANFD_MTU;

		/* CAN FD frame <canid>##<flags><data>* */
		if ((tmp = asc2nibble(cs[idx + 1])) > 0x0F)
			return 0;

		cu->fd.flags = tmp;
		cu->fd.flags |= CANFD_FDF; /* dual-use */
		idx += 2;

	} else if (cs[idx + 14] == CANID_DELIM) { /* CAN XL frame '#80:00:11223344#' */
		maxdlen = CANXL_MAX_DLEN;
		mtu = CANXL_MTU;
		data = cu->xl.data; /* fill CAN XL data */

		if ((cs[idx + 2] != XL_HDR_DELIM) || (cs[idx + 5] != XL_HDR_DELIM))
			return 0;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags |= tmp;

		/* force CAN XL flag if it was missing in the ASCII string */
		cu->xl.flags |= CANXL_XLF;

		idx++; /* skip XL_HDR_DELIM */

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt |= tmp;

		idx++; /* skip XL_HDR_DELIM */

		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
				return 0;
			cu->xl.af |= tmp << (7 - i) * 4;
		}

		idx++; /* skip CANID_DELIM */
	}

	for (i = 0, dlen = 0; i < maxdlen; i++) {
		if (cs[idx] == DATA_SEPERATOR) /* skip (optional) separator */
			idx++;

		if (idx >= len) /* end of string => end of data */
			break;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] |= tmp;
		dlen++;
	}

	if (mtu == CANXL_MTU)
		cu->xl.len = dlen;
	else
		cu->fd.len = dlen;

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if ((maxdlen == CAN_MAX_DLEN) && (dlen == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
		unsigned char dlc = asc2nibble(cs[idx]);

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC))
			cu->cc.len8_dlc = dlc;
	}

	return mtu;
}